

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImVec2 ImLineClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *p)

{
  float fVar1;
  float fVar3;
  ImVec2 IVar2;
  float fVar4;
  float fVar5;
  float fVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar9;
  
  fVar1 = (*a).x;
  fVar3 = (*a).y;
  fVar5 = (*b).x - fVar1;
  fVar8 = (*b).y - fVar3;
  fVar4 = (p->x - fVar1) * fVar5 + (p->y - fVar3) * fVar8;
  if (fVar4 < 0.0) {
    return *a;
  }
  fVar9 = fVar5 * fVar5 + fVar8 * fVar8;
  if (fVar9 < fVar4) {
    return *b;
  }
  auVar6._0_4_ = fVar5 * fVar4;
  auVar6._4_4_ = fVar8 * fVar4;
  auVar6._8_4_ = fVar4 * 0.0;
  auVar6._12_4_ = fVar4 * 0.0;
  auVar7._4_4_ = fVar9;
  auVar7._0_4_ = fVar9;
  auVar7._8_4_ = fVar9;
  auVar7._12_4_ = fVar9;
  auVar7 = divps(auVar6,auVar7);
  IVar2.x = fVar1 + auVar7._0_4_;
  IVar2.y = fVar3 + auVar7._4_4_;
  return IVar2;
}

Assistant:

static inline ImVec2 operator+(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x+rhs.x, lhs.y+rhs.y); }